

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_maximum_likelihood_parameter_generation.cc
# Opt level: O3

bool __thiscall
sptk::RecursiveMaximumLikelihoodParameterGeneration::Get
          (RecursiveMaximumLikelihoodParameterGeneration *this,
          vector<double,_std::allocator<double>_> *smoothed_static_parameters)

{
  uint uVar1;
  int iVar2;
  pointer pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  pointer pvVar8;
  bool bVar9;
  pointer pdVar10;
  size_type sVar11;
  ulong uVar12;
  long lVar13;
  size_type __new_size;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  bVar9 = false;
  if ((smoothed_static_parameters != (vector<double,_std::allocator<double>_> *)0x0) &&
     (bVar9 = false, this->is_valid_ != false)) {
    iVar6 = (*this->input_source_->_vptr_InputSourceInterface[4])();
    if ((char)iVar6 == '\0') {
      pdVar10 = (this->buffer_).static_and_dynamic_parameters.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar3 = (this->buffer_).static_and_dynamic_parameters.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      uVar7 = (ulong)((long)pdVar3 - (long)pdVar10) >> 4;
      lVar13 = (long)(int)uVar7;
      if ((uVar7 & 0xffffffff) != 0) {
        memset(pdVar10,0,lVar13 * 8);
      }
      auVar5 = _DAT_00112b80;
      auVar4 = _DAT_00112b70;
      if (pdVar10 + lVar13 != pdVar3) {
        uVar12 = (long)pdVar3 + (-8 - (long)(pdVar10 + lVar13));
        auVar16._8_4_ = (int)uVar12;
        auVar16._0_8_ = uVar12;
        auVar16._12_4_ = (int)(uVar12 >> 0x20);
        auVar14._0_8_ = uVar12 >> 3;
        auVar14._8_8_ = auVar16._8_8_ >> 3;
        uVar7 = 0;
        auVar14 = auVar14 ^ _DAT_00112b80;
        do {
          auVar15._8_4_ = (int)uVar7;
          auVar15._0_8_ = uVar7;
          auVar15._12_4_ = (int)(uVar7 >> 0x20);
          auVar16 = (auVar15 | auVar4) ^ auVar5;
          if ((bool)(~(auVar16._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar16._0_4_ ||
                      auVar14._4_4_ < auVar16._4_4_) & 1)) {
            pdVar10[lVar13 + uVar7] = 1.79769313486232e+308;
          }
          if ((auVar16._12_4_ != auVar14._12_4_ || auVar16._8_4_ <= auVar14._8_4_) &&
              auVar16._12_4_ <= auVar14._12_4_) {
            pdVar10[lVar13 + uVar7 + 1] = 1.79769313486232e+308;
          }
          uVar7 = uVar7 + 2;
        } while (((uVar12 >> 3) + 2 & 0xfffffffffffffffe) != uVar7);
      }
      if (this->num_remaining_frame_ < 2) {
        return false;
      }
      this->num_remaining_frame_ = this->num_remaining_frame_ + -1;
    }
    Forward(this);
    iVar6 = (*(this->super_InputSourceInterface)._vptr_InputSourceInterface[2])();
    pdVar10 = (smoothed_static_parameters->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_start;
    __new_size = (size_type)iVar6;
    if ((long)(smoothed_static_parameters->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_finish - (long)pdVar10 >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(smoothed_static_parameters,__new_size);
      pdVar10 = (smoothed_static_parameters->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_start;
    }
    bVar9 = true;
    if (0 < iVar6) {
      uVar1 = this->num_past_frame_;
      iVar6 = this->current_frame_;
      iVar2 = this->calculation_field_;
      pvVar8 = (this->buffer_).c.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar11 = 0;
      do {
        pdVar10[sVar11] =
             *(double *)
              (*(long *)&(pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + (long)((int)(~uVar1 + iVar6) % iVar2) * 8);
        sVar11 = sVar11 + 1;
        pvVar8 = pvVar8 + 1;
      } while (__new_size != sVar11);
    }
  }
  return bVar9;
}

Assistant:

bool RecursiveMaximumLikelihoodParameterGeneration::Get(
    std::vector<double>* smoothed_static_parameters) {
  if (!is_valid_ || NULL == smoothed_static_parameters) {
    return false;
  }

  if (!input_source_->Get(&buffer_.static_and_dynamic_parameters)) {
    const int static_and_dynamic_size(
        static_cast<int>(buffer_.static_and_dynamic_parameters.size() / 2));
    // Unobserbed mean is zero.
    std::fill(
        buffer_.static_and_dynamic_parameters.begin(),
        buffer_.static_and_dynamic_parameters.begin() + static_and_dynamic_size,
        0.0);
    // Unobserved variance is infinite.
    std::fill(
        buffer_.static_and_dynamic_parameters.begin() + static_and_dynamic_size,
        buffer_.static_and_dynamic_parameters.end(), kInf);
    if (num_remaining_frame_ <= 1) {
      return false;
    }
    --num_remaining_frame_;
  }
  Forward();

  const int static_size(GetSize());
  if (smoothed_static_parameters->size() !=
      static_cast<std::size_t>(static_size)) {
    smoothed_static_parameters->resize(static_size);
  }

  const int t((current_frame_ - num_past_frame_ - 1) % calculation_field_);
  double* output(&((*smoothed_static_parameters)[0]));
  for (int m(0); m < static_size; ++m) {
    output[m] = buffer_.c[m][t];
  }

  return true;
}